

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O0

raw_problem *
baryonyx::make_problem(raw_problem *__return_storage_ptr__,context_ptr *ctx,string *filename)

{
  bool bVar1;
  byte bVar2;
  type pcVar3;
  istream local_228 [8];
  ifstream ifs;
  string *filename_local;
  context_ptr *ctx_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)ctx);
  if (bVar1) {
    pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*(ctx);
    info<std::__cxx11::string>(pcVar3,"problem reads from file `{}\'\n",filename);
    std::ifstream::ifstream(local_228,(string *)filename,_S_in);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      raw_problem::raw_problem(__return_storage_ptr__,file_not_found);
    }
    else {
      pcVar3 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*(ctx);
      make_problem(__return_storage_ptr__,pcVar3,local_228);
    }
    std::ifstream::~ifstream(local_228);
  }
  else {
    raw_problem::raw_problem(__return_storage_ptr__,empty_context);
  }
  return __return_storage_ptr__;
}

Assistant:

raw_problem
make_problem(const baryonyx::context_ptr& ctx, const std::string& filename)
{
    if (ctx) {
        info(*ctx, "problem reads from file `{}'\n", filename);

        std::ifstream ifs(filename);
        if (!ifs.is_open())
            return raw_problem(
              baryonyx::file_format_error_tag::file_not_found);

        return make_problem(*ctx, ifs);
    }

    return raw_problem{ baryonyx::file_format_error_tag::empty_context };
}